

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

String xmrig::
       getOclString<int(*)(_cl_platform_id*,unsigned_int,unsigned_long,void*,unsigned_long*),_cl_platform_id*,unsigned_int>
                 (_func_int__cl_platform_id_ptr_uint_unsigned_long_void_ptr_unsigned_long_ptr *fn,
                 _cl_platform_id *obj,uint param)

{
  ulong __n;
  int iVar1;
  char *str;
  undefined4 in_ECX;
  undefined8 in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  code *in_RSI;
  String *in_RDI;
  String SVar3;
  char *buf;
  size_t size;
  String *this;
  ulong local_28;
  undefined4 local_1c;
  undefined8 local_18;
  code *local_10;
  
  local_28 = 0;
  this = in_RDI;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar1 = (*in_RSI)(in_RDX,in_ECX,0,0,&local_28);
  __n = local_28;
  if (iVar1 == 0) {
    str = (char *)operator_new__(local_28);
    memset(str,0,__n);
    (*local_10)(local_18,local_1c,local_28,str,0);
    String::String(this,str);
    sVar2 = extraout_RDX_00;
  }
  else {
    memset(this,0,0x10);
    String::String(this);
    sVar2 = extraout_RDX;
  }
  SVar3.m_size = sVar2;
  SVar3.m_data = (char *)in_RDI;
  return SVar3;
}

Assistant:

static String getOclString(FUNC fn, OBJ obj, PARAM param)
{
    size_t size = 0;
    if (fn(obj, param, 0, nullptr, &size) != CL_SUCCESS) {
        return String();
    }

    char *buf = new char[size]();
    fn(obj, param, size, buf, nullptr);

    return String(buf);
}